

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

void av1_free_txb_buf(AV1_COMP *cpi)

{
  undefined8 *memblk;
  long in_RDI;
  CoeffBufferPool *coeff_buf_pool;
  
  memblk = (undefined8 *)(in_RDI + 0x3bf68);
  aom_free(memblk);
  *(undefined8 *)(in_RDI + 0x3bf60) = 0;
  aom_free(memblk);
  *memblk = 0;
  aom_free(memblk);
  memblk[1] = 0;
  aom_free(memblk);
  memblk[2] = 0;
  return;
}

Assistant:

void av1_free_txb_buf(AV1_COMP *cpi) {
  CoeffBufferPool *coeff_buf_pool = &cpi->coeff_buffer_pool;
  aom_free(cpi->coeff_buffer_base);
  cpi->coeff_buffer_base = NULL;
  aom_free(coeff_buf_pool->tcoeff);
  coeff_buf_pool->tcoeff = NULL;
  aom_free(coeff_buf_pool->eobs);
  coeff_buf_pool->eobs = NULL;
  aom_free(coeff_buf_pool->entropy_ctx);
  coeff_buf_pool->entropy_ctx = NULL;
}